

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MLMatcherSD.cpp
# Opt level: O1

int __thiscall Kernel::MLMatcherSD::Impl::init(Impl *this,EVP_PKEY_CTX *ctx)

{
  Literal **ppLVar1;
  List<Kernel::Literal_*> **ppLVar2;
  Literal *pLVar3;
  TermList *pTVar4;
  uint *puVar5;
  uint uVar6;
  uint **ppuVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  Clause *in_RCX;
  uint uVar11;
  uint in_EDX;
  List<Kernel::Literal_*> *pLVar12;
  uint uVar13;
  long in_R8;
  size_t s;
  size_t s_00;
  size_t s_01;
  ulong uVar14;
  uint uVar15;
  uint uStack_70;
  uint uStack_5c;
  
  uVar14 = (ulong)in_EDX;
  ::Lib::DArray<Kernel::Literal_*>::ensure(&this->s_baseLits,uVar14);
  if (in_EDX == 0) {
    ::Lib::DArray<const_Lib::List<Kernel::Literal_*>_*>::ensure(&this->s_altsArr,uVar14);
  }
  else {
    ppLVar1 = (this->s_baseLits)._array;
    uVar10 = uVar14;
    do {
      ppLVar1[uVar10 - 1] = *(Literal **)(ctx + uVar10 * 8 + -8);
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
    ::Lib::DArray<const_Lib::List<Kernel::Literal_*>_*>::ensure(&this->s_altsArr,uVar14);
    if (in_EDX != 0) {
      ppLVar2 = (this->s_altsArr)._array;
      uVar10 = uVar14;
      do {
        ppLVar2[uVar10 - 1] = *(List<Kernel::Literal_*> **)(in_R8 + -8 + uVar10 * 8);
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
  }
  ::Lib::DArray<unsigned_int>::ensure(&this->s_varCnts,uVar14);
  ::Lib::DArray<unsigned_int_*>::ensure(&this->s_boundVarNums,uVar14);
  if (in_EDX != 0) {
    ppuVar7 = (this->s_boundVarNums)._array + uVar14;
    do {
      ppuVar7[-1] = (uint *)0x0;
      ppuVar7 = ppuVar7 + -1;
    } while (ppuVar7 != (this->s_boundVarNums)._array);
  }
  ::Lib::DArray<Kernel::TermList_**>::ensure(&this->s_altPtrs,uVar14);
  ::Lib::TriangularArray<unsigned_int>::setSide(&this->s_remaining,uVar14);
  ::Lib::DArray<unsigned_int>::ensure(&this->s_nextAlts,uVar14);
  ::Lib::TriangularArray<std::pair<int,_int>_*>::setSide(&this->s_intersections,uVar14);
  uVar13 = 0;
  memset((this->s_intersections)._data,0,(this->s_intersections)._capacity << 3);
  uStack_5c = Term::getDistinctVars(&(*(this->s_baseLits)._array)->super_Term);
  if (in_EDX == 0) {
    s_01 = 0;
    s_00 = 0;
    s = 0;
    uStack_70 = 0;
  }
  else {
    uVar11 = 0;
    uVar10 = 0;
    uStack_70 = 0;
    s = 0;
    s_00 = 0;
    s_01 = 0;
    uVar13 = 0;
    do {
      uVar15 = (uint)uVar10;
      uVar6 = Term::getDistinctVars(&(this->s_baseLits)._array[uVar10]->super_Term);
      pLVar12 = (this->s_altsArr)._array[uVar10];
      uVar9 = 0;
      if (pLVar12 != (List<Kernel::Literal_*> *)0x0) {
        uVar9 = 0;
        do {
          ppLVar1 = &pLVar12->_head;
          pLVar12 = pLVar12->_tail;
          uVar9 = uVar9 + 1 + (uint)(((*ppLVar1)->super_Term)._functor == 0);
        } while (pLVar12 != (List<Kernel::Literal_*> *)0x0);
      }
      if (uVar9 == 1) {
        if (uVar13 != uVar15) {
          ppLVar1 = (this->s_baseLits)._array;
          pLVar3 = ppLVar1[(int)uVar15];
          ppLVar1[(int)uVar15] = ppLVar1[(int)uVar13];
          ppLVar1[(int)uVar13] = pLVar3;
          ppLVar2 = (this->s_altsArr)._array;
          pLVar12 = ppLVar2[(int)uVar15];
          ppLVar2[(int)uVar15] = ppLVar2[(int)uVar13];
          ppLVar2[(int)uVar13] = pLVar12;
          if (uStack_70 == uVar13) {
            uStack_70 = uVar15;
          }
        }
LAB_00566a5e:
        uVar13 = uVar13 + 1;
      }
      else {
        if (uVar9 == 0) {
          if (uVar11 != uVar15) {
            if (uVar13 != uVar11) {
              ppLVar1 = (this->s_baseLits)._array;
              pLVar3 = ppLVar1[(int)uVar13];
              ppLVar1[(int)uVar13] = ppLVar1[(int)uVar11];
              ppLVar1[(int)uVar11] = pLVar3;
              ppLVar2 = (this->s_altsArr)._array;
              pLVar12 = ppLVar2[(int)uVar13];
              ppLVar2[(int)uVar13] = ppLVar2[(int)uVar11];
              ppLVar2[(int)uVar11] = pLVar12;
            }
            ppLVar1 = (this->s_baseLits)._array;
            pLVar3 = ppLVar1[(int)uVar15];
            ppLVar1[(int)uVar15] = ppLVar1[(int)uVar11];
            ppLVar1[(int)uVar11] = pLVar3;
            ppLVar2 = (this->s_altsArr)._array;
            pLVar12 = ppLVar2[(int)uVar15];
            ppLVar2[(int)uVar15] = ppLVar2[(int)uVar11];
            ppLVar2[(int)uVar11] = pLVar12;
            if (uStack_70 == uVar13) {
              uStack_70 = uVar15;
            }
          }
          uVar11 = uVar11 + 1;
          goto LAB_00566a5e;
        }
        if (uVar15 != 0 && uStack_5c < uVar6) {
          uStack_70 = uVar15;
          uStack_5c = uVar6;
        }
      }
      s_01 = s_01 + uVar6;
      s_00 = s_00 + uVar9;
      s = s + (uVar6 + 1) * uVar9;
      uVar10 = (ulong)(uVar15 + 1);
    } while (uVar15 + 1 != in_EDX);
  }
  if (uVar13 < uStack_70) {
    lVar8 = (long)(int)uStack_70;
    ppLVar1 = (this->s_baseLits)._array;
    pLVar3 = ppLVar1[lVar8];
    ppLVar1[lVar8] = ppLVar1[(int)uVar13];
    ppLVar1[(int)uVar13] = pLVar3;
    ppLVar2 = (this->s_altsArr)._array;
    pLVar12 = ppLVar2[lVar8];
    ppLVar2[lVar8] = ppLVar2[(int)uVar13];
    ppLVar2[(int)uVar13] = pLVar12;
  }
  ::Lib::DArray<unsigned_int>::ensure(&this->s_boundVarNumData,s_01);
  ::Lib::DArray<Kernel::TermList_*>::ensure(&this->s_altBindingPtrs,s_00);
  ::Lib::DArray<Kernel::TermList>::ensure(&this->s_altBindingsData,s);
  ::Lib::DArray<std::pair<int,_int>_>::ensure(&this->s_intersectionData,(s_01 + uVar14) * uVar14);
  (this->s_matchingData).len = in_EDX;
  (this->s_matchingData).varCnts = (this->s_varCnts)._array;
  (this->s_matchingData).boundVarNums = (this->s_boundVarNums)._array;
  (this->s_matchingData).altBindings = (this->s_altPtrs)._array;
  (this->s_matchingData).remaining = &this->s_remaining;
  (this->s_matchingData).nextAlts = (this->s_nextAlts)._array;
  (this->s_matchingData).intersections = &this->s_intersections;
  ppLVar2 = (this->s_altsArr)._array;
  (this->s_matchingData).bases = (this->s_baseLits)._array;
  (this->s_matchingData).alts = ppLVar2;
  (this->s_matchingData).instance = in_RCX;
  (this->s_matchingData).eqLitForDemodulation = 0xffffffff;
  (this->s_matchingData).boundVarNumStorage = (this->s_boundVarNumData)._array;
  pTVar4 = (this->s_altBindingsData)._array;
  (this->s_matchingData).altBindingPtrStorage = (this->s_altBindingPtrs)._array;
  (this->s_matchingData).altBindingStorage = pTVar4;
  (this->s_matchingData).intersectionStorage = (this->s_intersectionData)._array;
  uVar14 = *(ulong *)&in_RCX->field_0x38;
  ::Lib::DArray<unsigned_int>::ensure(&(this->s_matchingData).matchRecord,uVar14 & 0xfffff);
  uVar14 = uVar14 & 0xfffff;
  if (uVar14 != 0) {
    memset((this->s_matchingData).matchRecord._array,0xff,(ulong)(uint)((int)uVar14 << 2));
  }
  puVar5 = (this->s_matchingData).nextAlts;
  *puVar5 = 0;
  (this->s_matchingData).currBLit = 0;
  return (int)puVar5;
}

Assistant:

void MLMatcherSD::Impl::init(Literal** baseLits, unsigned baseLen, Clause* instance, LiteralList const* const* alts)
{
#if MLMATCHERSD_DEBUG_OUTPUT
    std::cerr << "\n\n\nMLMatcherSD::init:" << std::endl;
    for (unsigned i = 0; i < baseLen; ++i) {
      std::cerr <<   "\tbases[" << i << "]: " << baseLits[i]->toString() << std::endl;
      LiteralList::Iterator ait(alts[i]);
      while(ait.hasNext()) {
        std::cerr << "\t     alt: " << ait.next()->toString() << std::endl;
      }
    }
    std::cerr << "\tinstance: " << instance->toString() << std::endl;
#endif
  initMatchingData(baseLits, baseLen, instance, alts);
}